

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::WriteStream(Matrix *matrix_to_write,ostream *output_stream)

{
  byte bVar1;
  int iVar2;
  double *pdVar3;
  char *in_RSI;
  Matrix *in_RDI;
  int in_stack_ffffffffffffffcc;
  Matrix *in_stack_ffffffffffffffd0;
  
  iVar2 = Matrix::GetNumRow(in_RDI);
  if (((iVar2 != 0) && (iVar2 = Matrix::GetNumColumn(in_RDI), iVar2 != 0)) &&
     (in_RSI != (char *)0x0)) {
    pdVar3 = Matrix::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    Matrix::GetNumRow(in_RDI);
    Matrix::GetNumColumn(in_RDI);
    std::ostream::write(in_RSI,(long)pdVar3);
    bVar1 = std::ios::fail();
    return (bool)((bVar1 ^ 0xff) & 1);
  }
  return false;
}

Assistant:

bool WriteStream(const sptk::Matrix& matrix_to_write,
                 std::ostream* output_stream) {
  if (0 == matrix_to_write.GetNumRow() || 0 == matrix_to_write.GetNumColumn() ||
      NULL == output_stream) {
    return false;
  }

  output_stream->write(reinterpret_cast<const char*>(&(matrix_to_write[0][0])),
                       sizeof(matrix_to_write[0][0]) *
                           matrix_to_write.GetNumRow() *
                           matrix_to_write.GetNumColumn());

  return !output_stream->fail();
}